

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O2

UnknownField * __thiscall google::protobuf::UnknownFieldSet::field(UnknownFieldSet *this,int index)

{
  LogMessage *other;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  pvVar1 = this->fields_;
  if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
               ,0x11c);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: fields_ != NULL: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    pvVar1 = this->fields_;
  }
  return (pvVar1->
         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
         )._M_impl.super__Vector_impl_data._M_start + index;
}

Assistant:

inline const UnknownField& UnknownFieldSet::field(int index) const {
  GOOGLE_DCHECK(fields_ != NULL);
  return (*fields_)[index];
}